

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::scan
               (FunctionOptimizer *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_> *pPVar6;
  _func_void_FunctionOptimizer_ptr_Expression_ptr_ptr_conflict *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitBlock,
               currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      goto LAB_007102e6;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_0070ff69:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
                  (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_007102e6;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                     ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                     super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_0070feae;
  case LoopId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitLoop,currp
              );
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_007102e6;
    }
    goto LAB_0070fb10;
  case BreakId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitBreak,
               currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_007102e6;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                     ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                     super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_0070f725;
  case SwitchId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitSwitch,
               currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_007102e6;
    }
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               scan,(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x0070f4b3;
  case CallId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitCall,currp
              );
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_007102e6;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0070ff69;
        Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
                  (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_007102e6;
    }
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               scan,(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_0070ff69;
        Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
                  (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>
                   ,scan,(Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitLocalGet,
               currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_007102e6;
    }
    break;
  case LocalSetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitLocalSet,
               currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_007102e6;
    }
    goto LAB_0070fc12;
  case GlobalGetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitGlobalGet,
               currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_007102e6;
    }
    break;
  case GlobalSetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitGlobalSet,
               currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_007102e6;
    }
    goto LAB_0070fb10;
  case LoadId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitLoad,currp
              );
    if (pEVar1->_id == LoadId) {
      pEVar1 = pEVar1 + 3;
      goto LAB_0070feae;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Load]";
    goto LAB_007102e6;
  case StoreId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitStore,
               currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_007102e6;
    }
    goto LAB_0070fbd7;
  case ConstId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitConst,
               currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_007102e6;
    }
    break;
  case UnaryId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitUnary,
               currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_007102e6;
    }
    goto LAB_0070fc12;
  case BinaryId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitBinary,
               currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe8e;
  case SelectId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitSelect,
               currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_007102e6;
    }
    goto LAB_0070f804;
  case DropId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitDrop,currp
              );
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe62;
  case ReturnId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitReturn,
               currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_007102e6;
    }
    goto LAB_0070f4aa;
  case MemorySizeId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitMemorySize
               ,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_007102e6;
    }
    break;
  case MemoryGrowId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitMemoryGrow
               ,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe62;
  case NopId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitNop,currp)
    ;
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_007102e6;
    }
    break;
  case UnreachableId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_007102e6;
    }
    break;
  case AtomicRMWId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitAtomicRMW,
               currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_007102e6;
    }
    goto LAB_0070fcbd;
  case AtomicCmpxchgId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_007102e6;
    }
    goto LAB_0070fca3;
  case AtomicWaitId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitAtomicWait
               ,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_007102e6;
    }
    goto LAB_0070f331;
  case AtomicNotifyId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe8e;
  case AtomicFenceId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_007102e6;
    }
    break;
  case SIMDExtractId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_007102e6;
    }
    goto LAB_0070fc12;
  case SIMDReplaceId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_007102e6;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_0070fe99;
  case SIMDShuffleId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe00;
  case SIMDTernaryId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_007102e6;
    }
    goto LAB_0070f331;
  case SIMDShiftId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitSIMDShift,
               currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe8e;
  case SIMDLoadId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitSIMDLoad,
               currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_007102e6;
    }
    goto LAB_0070fa39;
  case SIMDLoadStoreLaneId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_007102e6;
    }
LAB_0070fbd7:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_0070feae;
  case MemoryInitId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitMemoryInit
               ,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_007102e6;
    }
LAB_0070fca3:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_0070fcbd;
  case DataDropId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitDataDrop,
               currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_007102e6;
    }
    break;
  case MemoryCopyId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitMemoryCopy
               ,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_007102e6;
    }
    goto LAB_0070f804;
  case MemoryFillId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitMemoryFill
               ,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_007102e6;
    }
    goto LAB_0070f804;
  case PopId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitPop,currp)
    ;
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_007102e6;
    }
    break;
  case RefNullId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitRefNull,
               currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_007102e6;
    }
    break;
  case RefIsNullId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitRefIsNull,
               currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe62;
  case RefFuncId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitRefFunc,
               currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_007102e6;
    }
    break;
  case RefEqId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitRefEq,
               currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe00;
  case TableGetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitTableGet,
               currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_007102e6;
    }
    goto LAB_0070fb10;
  case TableSetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitTableSet,
               currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_007102e6;
    }
    goto LAB_0070fcbd;
  case TableSizeId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitTableSize,
               currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_007102e6;
    }
    break;
  case TableGrowId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitTableGrow,
               currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_007102e6;
    }
LAB_0070fcbd:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_0070feae;
  case TryId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitTry,currp)
    ;
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_007102e6;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_0070ff69;
        Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
                  (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>
                   ,scan,(Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_0070fb10:
    pEVar1 = pEVar1 + 2;
    goto LAB_0070feae;
  case ThrowId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitThrow,
               currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_007102e6;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_0070ff69;
        Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
                  (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitRethrow,
               currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_007102e6;
    }
    break;
  case TupleMakeId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitTupleMake,
               currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_007102e6;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0070ff69;
        Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
                  (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe62;
  case I31NewId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitI31New,
               currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe62;
  case I31GetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitI31Get,
               currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe62;
  case CallRefId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitCallRef,
               currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_007102e6;
    }
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               scan,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0070ff69;
        Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
                  (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitRefTest,
               currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe62;
  case RefCastId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitRefCast,
               currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe62;
  case BrOnId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitBrOn,currp
              );
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_007102e6;
    }
LAB_0070fa39:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_0070feae;
  case StructNewId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitStructNew,
               currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_007102e6;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0070ff69;
        Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
                  (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitStructGet,
               currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_007102e6;
    }
    goto LAB_0070fc12;
  case StructSetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitStructSet,
               currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe8e;
  case ArrayNewId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitArrayNew,
               currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_007102e6;
    }
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               scan,(Expression **)&pEVar1[1].type);
LAB_0070f4aa:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x0070f4b3:
    if (lVar5 != 0) {
LAB_0070f725:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                     ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                     super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_007102e6;
    }
    goto LAB_0070f55a;
  case ArrayNewFixedId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_007102e6;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0070ff69;
        Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
                  (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitArrayGet,
               currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe00;
  case ArraySetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitArraySet,
               currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_007102e6;
    }
    goto LAB_0070f804;
  case ArrayLenId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitArrayLen,
               currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe62;
  case ArrayCopyId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitArrayCopy,
               currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_007102e6;
    }
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               scan,(Expression **)(pEVar1 + 3));
    goto LAB_0070f2cb;
  case ArrayFillId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitArrayFill,
               currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_007102e6;
    }
LAB_0070f2cb:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_0070f804;
  case ArrayInitId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitArrayInit,
               currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_007102e6;
    }
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               scan,(Expression **)(pEVar1 + 4));
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               scan,(Expression **)&pEVar1[3].type);
LAB_0070f55a:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_0070feae;
  case RefAsId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitRefAs,
               currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_007102e6;
    }
    goto LAB_0070fc12;
  case StringNewId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitStringNew,
               currp);
    if (pEVar1->_id == StringNewId) {
      local_38 = pEVar1 + 3;
      local_40 = scan;
      if (*(long *)(pEVar1 + 3) != 0) {
        SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                       ).
                       super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                       super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                       stack,&local_40,(Expression ***)&local_38);
      }
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                       ).
                       super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                       super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                       stack,&local_40,(Expression ***)&local_38);
      }
      local_38 = pEVar1 + 2;
      local_40 = scan;
      if (*(long *)(pEVar1 + 2) != 0) {
        SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                       ).
                       super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                       super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                       stack,&local_40,(Expression ***)&local_38);
      }
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_0070feae;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
    goto LAB_007102e6;
  case StringConstId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_007102e6;
    }
    break;
  case StringMeasureId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_007102e6;
    }
    goto LAB_0070fc12;
  case StringEncodeId:
    pPVar6 = &(self->
              super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitStringEncode,currp);
    if (pEVar1->_id == StringEncodeId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,wasm::Visitor<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                       ).
                       super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                       super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                       stack,&local_40,(Expression ***)&local_38);
      }
      Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
                (&pPVar6->super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
                 scan,(Expression **)(pEVar1 + 2));
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_0070feae;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
LAB_007102e6:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,__function);
  case StringConcatId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe00;
  case StringEqId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitStringEq,
               currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe8e;
  case StringAsId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::doVisitStringAs,
               currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_007102e6;
    }
LAB_0070fc12:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_0070feae;
  case StringWTF8AdvanceId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_007102e6;
    }
LAB_0070f804:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,scan,
               (Expression **)(pEVar1 + 2));
    goto LAB_0070fe00;
  case StringWTF16GetId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_007102e6;
    }
    goto LAB_0070fe00;
  case StringIterNextId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_007102e6;
    }
LAB_0070fe62:
    pEVar1 = pEVar1 + 1;
LAB_0070feae:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,scan,
               (Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_007102e6;
    }
LAB_0070fe8e:
    currp_00 = pEVar1 + 2;
LAB_0070fe99:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_0070feae;
  case StringSliceWTFId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_007102e6;
    }
LAB_0070f331:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_0070fe99;
  case StringSliceIterId:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::
               doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_007102e6;
    }
LAB_0070fe00:
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                ).super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.
                super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_0070feae;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }